

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int extension_is_ply(char *filename)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  if (*filename == '\0') {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      lVar7 = uVar3 + 1;
      uVar3 = uVar3 + 1;
    } while (filename[lVar7] != '\0');
  }
  lVar7 = (long)(int)uVar3;
  uVar6 = uVar3 & 0xffffffff;
  uVar2 = 0;
  lVar1 = lVar7 << 0x20;
  do {
    lVar4 = lVar1;
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) {
      uVar5 = 0;
      break;
    }
    uVar5 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar5;
    lVar1 = lVar4 + -0x100000000;
  } while (filename[lVar7] != '.');
  if ((((filename[(int)uVar5] == '.') && ((int)uVar3 - uVar5 == 4)) &&
      (lVar4 = lVar4 >> 0x20, (byte)(filename[lVar4] | 0x20U) == 0x70)) &&
     ((byte)(filename[lVar4 + 1] | 0x20U) == 0x6c)) {
    uVar2 = (uint)((filename[lVar4 + 2] + 0xa7U & 0xdf) == 0);
  }
  return uVar2;
}

Assistant:

static int extension_is_ply(const char* filename)
  {
  const char* filename_ptr = filename;
  int filename_length = 0;
  while (*filename_ptr++)
    ++filename_length;

  int find_last_dot = filename_length - 1;
  while (find_last_dot)
    {
    if (filename[find_last_dot] == '.')
      break;
    --find_last_dot;
    }
  if (filename[find_last_dot] != '.')
    return 0;
  if ((filename_length - find_last_dot) != 4)
    return 0;
  if ((filename[find_last_dot + 1] == 'p' || filename[find_last_dot + 1] == 'P') &&
    (filename[find_last_dot + 2] == 'l' || filename[find_last_dot + 2] == 'L') &&
    (filename[find_last_dot + 3] == 'y' || filename[find_last_dot + 3] == 'Y'))
    return 1;
  return 0;
  }